

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

Image * GenImageChecked(Image *__return_storage_ptr__,int width,int height,int checksX,int checksY,
                       Color col1,Color col2)

{
  void *pvVar1;
  int local_30;
  int local_2c;
  int x;
  int y;
  Color *pixels;
  int checksY_local;
  int checksX_local;
  int height_local;
  int width_local;
  Color col1_local;
  
  pvVar1 = malloc((long)(width * height) << 2);
  for (local_2c = 0; local_2c < height; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < width; local_30 = local_30 + 1) {
      if ((local_30 / checksX + local_2c / checksY) % 2 == 0) {
        *(Color *)((long)pvVar1 + (long)(local_2c * width + local_30) * 4) = col1;
      }
      else {
        *(Color *)((long)pvVar1 + (long)(local_2c * width + local_30) * 4) = col2;
      }
    }
  }
  __return_storage_ptr__->data = pvVar1;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImageChecked(int width, int height, int checksX, int checksY, Color col1, Color col2)
{
    Color *pixels = (Color *)RL_MALLOC(width*height*sizeof(Color));

    for (int y = 0; y < height; y++)
    {
        for (int x = 0; x < width; x++)
        {
            if ((x/checksX + y/checksY)%2 == 0) pixels[y*width + x] = col1;
            else pixels[y*width + x] = col2;
        }
    }

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}